

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitWriter.cc
# Opt level: O0

void __thiscall BitWriter::writeBitsSigned(BitWriter *this,longlong val,size_t bits)

{
  unsigned_long_long local_28;
  unsigned_long_long uval;
  size_t bits_local;
  longlong val_local;
  BitWriter *this_local;
  
  local_28 = val;
  if (val < 0) {
    local_28 = (1L << ((byte)bits & 0x3f)) + val;
  }
  writeBits(this,local_28,bits);
  return;
}

Assistant:

void
BitWriter::writeBitsSigned(long long val, size_t bits)
{
    unsigned long long uval = 0;
    if (val < 0) {
        uval = (1ULL << bits) + static_cast<unsigned long long>(val);
    } else {
        uval = static_cast<unsigned long long>(val);
    }
    writeBits(uval, bits);
}